

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game.cpp
# Opt level: O0

void __thiscall Game::Run(Game *this,Renderer *renderer,size_t target_frame_duration)

{
  bool *__t;
  int iVar1;
  Uint32 UVar2;
  Snake local_138;
  Snake local_f8;
  reference_wrapper<Snake> local_a8;
  reference_wrapper<bool> local_a0;
  code *local_98;
  undefined8 local_90;
  thread local_88;
  thread player2Input;
  reference_wrapper<bool> local_78;
  code *local_70;
  undefined8 local_68;
  thread local_60;
  thread player1Input;
  Controller player_2_controller;
  Controller player_1_controller;
  bool running;
  int frame_count;
  Uint32 frame_duration;
  Uint32 frame_end;
  Uint32 frame_start;
  Uint32 title_timestamp;
  size_t target_frame_duration_local;
  Renderer *renderer_local;
  Game *this_local;
  
  frame_end = SDL_GetTicks();
  player_1_controller._Left = 0;
  player_1_controller._Right._3_1_ = 1;
  Controller::Controller
            ((Controller *)&player_2_controller._Right,0x40000052,0x40000051,0x4000004f,0x40000050);
  Controller::Controller((Controller *)&player1Input,0x77,0x73,100,0x61);
  while ((player_1_controller._Right._3_1_ & 1) != 0) {
    iVar1 = SDL_GetTicks();
    local_70 = Controller::HandleInput;
    local_68 = 0;
    __t = (bool *)((long)&player_1_controller._Right + 3);
    local_78 = std::ref<bool>(__t);
    player2Input._M_id._M_thread = (id)std::ref<Snake>(&this->snake);
    std::thread::
    thread<void(Controller::*)(bool&,Snake&)const,Controller&,std::reference_wrapper<bool>,std::reference_wrapper<Snake>,void>
              (&local_60,(type *)&local_70,(Controller *)&player_2_controller._Right,&local_78,
               (reference_wrapper<Snake> *)&player2Input);
    local_98 = Controller::HandleInput;
    local_90 = 0;
    local_a0 = std::ref<bool>(__t);
    local_a8 = std::ref<Snake>(&this->snake2);
    std::thread::
    thread<void(Controller::*)(bool&,Snake&)const,Controller&,std::reference_wrapper<bool>,std::reference_wrapper<Snake>,void>
              (&local_88,(type *)&local_98,(Controller *)&player1Input,&local_a0,&local_a8);
    std::thread::join();
    std::thread::join();
    Update(this);
    Snake::Snake(&local_f8,&this->snake);
    Snake::Snake(&local_138,&this->snake2);
    Renderer::Render(renderer,&local_f8,&local_138,&this->food);
    Snake::~Snake(&local_138);
    Snake::~Snake(&local_f8);
    UVar2 = SDL_GetTicks();
    player_1_controller._Left = player_1_controller._Left + 1;
    if (999 < UVar2 - frame_end) {
      Renderer::UpdateWindowTitle(renderer,this->score,player_1_controller._Left);
      player_1_controller._Left = 0;
      frame_end = UVar2;
    }
    if (UVar2 - iVar1 < target_frame_duration) {
      frame_start = (Uint32)target_frame_duration;
      SDL_Delay(frame_start - (UVar2 - iVar1));
    }
    std::thread::~thread(&local_88);
    std::thread::~thread(&local_60);
  }
  return;
}

Assistant:

void Game::Run(Renderer &renderer, std::size_t target_frame_duration) { 
	Uint32 title_timestamp = SDL_GetTicks();
    Uint32 frame_start;
    Uint32 frame_end;
    Uint32 frame_duration;
    int frame_count = 0;
    bool running = true;
  	
  	Controller player_1_controller(SDLK_UP, SDLK_DOWN, SDLK_RIGHT, SDLK_LEFT);
  	Controller player_2_controller(SDLK_w, SDLK_s, SDLK_d, SDLK_a);
  	
    while (running) {
      frame_start = SDL_GetTicks();

    // Input, Update, Render - the main game loop.
    std::thread player1Input(&Controller::HandleInput, player_1_controller, std::ref(running), std::ref(snake));
    std::thread player2Input(&Controller::HandleInput, player_2_controller, std::ref(running), std::ref(snake2));
    player1Input.join();
    player2Input.join();
    
    Update();
    renderer.Render(snake, snake2, food);


      frame_end = SDL_GetTicks();

      // Keep track of how long each loop through the input/update/render cycle
      // takes.
      frame_count++;
      frame_duration = frame_end - frame_start;

      // After every second, update the window title.
      if (frame_end - title_timestamp >= 1000) {
        renderer.UpdateWindowTitle(score, frame_count);
        frame_count = 0;
        title_timestamp = frame_end;
      }

      // If the time for this frame is too small (i.e. frame_duration is
      // smaller than the target ms_per_frame), delay the loop to
      // achieve the correct frame rate.
      if (frame_duration < target_frame_duration) {
        SDL_Delay(target_frame_duration - frame_duration);
      }
  	}  
}